

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSort.c
# Opt level: O0

void Msat_SolverSortSelection(Msat_Clause_t **array,int size)

{
  Msat_Clause_t *pMVar1;
  float fVar2;
  float fVar3;
  int local_2c;
  int local_28;
  int best_i;
  int j;
  int i;
  Msat_Clause_t *tmp;
  int size_local;
  Msat_Clause_t **array_local;
  
  for (best_i = 0; best_i < size + -1; best_i = best_i + 1) {
    local_2c = best_i;
    local_28 = best_i;
    while (local_28 = local_28 + 1, local_28 < size) {
      fVar2 = Msat_ClauseReadActivity(array[local_28]);
      fVar3 = Msat_ClauseReadActivity(array[local_2c]);
      if (fVar2 < fVar3) {
        local_2c = local_28;
      }
    }
    pMVar1 = array[best_i];
    array[best_i] = array[local_2c];
    array[local_2c] = pMVar1;
  }
  return;
}

Assistant:

void Msat_SolverSortSelection( Msat_Clause_t ** array, int size )
{
    Msat_Clause_t * tmp;
    int i, j, best_i;
    for ( i = 0; i < size-1; i++ )
    {
        best_i = i;
        for (j = i+1; j < size; j++)
        {
            if ( Msat_ClauseReadActivity(array[j]) < Msat_ClauseReadActivity(array[best_i]) )
                best_i = j;
        }
        tmp = array[i]; array[i] = array[best_i]; array[best_i] = tmp;
    }
}